

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_objects.cc
# Opt level: O0

void __thiscall QPDF::setLastObjectDescription(QPDF *this,string *description,QPDFObjGen og)

{
  string *psVar1;
  bool bVar2;
  ulong uVar3;
  pointer pMVar4;
  string local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  string *local_20;
  string *description_local;
  QPDF *this_local;
  QPDFObjGen og_local;
  
  local_20 = description;
  description_local = (string *)this;
  this_local = (QPDF *)og;
  std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->(&this->m);
  std::__cxx11::string::clear();
  uVar3 = std::__cxx11::string::empty();
  psVar1 = local_20;
  if ((uVar3 & 1) == 0) {
    pMVar4 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->
                       (&this->m);
    std::__cxx11::string::operator+=((string *)&pMVar4->last_object_description,(string *)psVar1);
    bVar2 = QPDFObjGen::isIndirect((QPDFObjGen *)&this_local);
    if (bVar2) {
      pMVar4 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->
                         (&this->m);
      std::__cxx11::string::operator+=((string *)&pMVar4->last_object_description,": ");
    }
  }
  bVar2 = QPDFObjGen::isIndirect((QPDFObjGen *)&this_local);
  if (bVar2) {
    QPDFObjGen::unparse_abi_cxx11_(&local_60,(QPDFObjGen *)&this_local,' ');
    std::operator+(&local_40,"object ",&local_60);
    pMVar4 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->
                       (&this->m);
    std::__cxx11::string::operator+=((string *)&pMVar4->last_object_description,(string *)&local_40)
    ;
    std::__cxx11::string::~string((string *)&local_40);
    std::__cxx11::string::~string((string *)&local_60);
  }
  return;
}

Assistant:

void
QPDF::setLastObjectDescription(std::string const& description, QPDFObjGen og)
{
    m->last_object_description.clear();
    if (!description.empty()) {
        m->last_object_description += description;
        if (og.isIndirect()) {
            m->last_object_description += ": ";
        }
    }
    if (og.isIndirect()) {
        m->last_object_description += "object " + og.unparse(' ');
    }
}